

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O2

btVector3 __thiscall btBoxShape::localGetSupportingVertex(btBoxShape *this,btVector3 *vec)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  float extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  float fVar6;
  undefined1 auVar7 [16];
  btVector3 bVar8;
  float local_48;
  float fStack_44;
  float local_28;
  float fStack_24;
  
  fVar6 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  uVar1 = *(undefined8 *)
           ((this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
            m_implicitShapeDimensions.m_floats + 1);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  fVar6 = extraout_XMM0_Da + fVar6;
  local_48 = (float)extraout_XMM0_Qa;
  fStack_44 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  local_28 = (float)uVar1;
  fStack_24 = (float)((ulong)uVar1 >> 0x20);
  fStack_24 = (float)extraout_XMM0_Qa_00 + fStack_24;
  uVar4 = -(uint)(0.0 <= vec->m_floats[0]);
  bVar8.m_floats[0] = ~uVar4 & (uint)-fVar6 | uVar4 & (uint)fVar6;
  uVar4 = -(uint)(0.0 <= (float)*(undefined8 *)(vec->m_floats + 1));
  uVar5 = -(uint)(0.0 <= (float)((ulong)*(undefined8 *)(vec->m_floats + 1) >> 0x20));
  auVar7._0_4_ = ~uVar4 & (uint)-(local_48 + local_28);
  auVar7._4_4_ = ~uVar5 & (uint)-fStack_24;
  auVar7._8_8_ = 0;
  auVar3._4_4_ = (uint)fStack_24 & uVar5;
  auVar3._0_4_ = (uint)(local_48 + local_28) & uVar4;
  auVar3._8_4_ = fStack_44 + 0.0;
  auVar3._12_4_ = (float)((ulong)extraout_XMM0_Qa_00 >> 0x20) + 0.0;
  bVar8.m_floats[1] = (btScalar)SUB164(auVar7 | auVar3,0);
  uVar2 = SUB168(auVar7 | auVar3,0) >> 0x20;
  bVar8.m_floats[2] = (btScalar)(int)uVar2;
  bVar8.m_floats[3] = (btScalar)(int)(uVar2 >> 0x20);
  return (btVector3)bVar8.m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();
		btVector3 margin(getMargin(),getMargin(),getMargin());
		halfExtents += margin;
		
		return btVector3(btFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
			btFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
			btFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
	}